

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

uint64_t __thiscall roaring::Roaring64Map::cardinality(Roaring64Map *this)

{
  bool bVar1;
  length_error *this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  unsigned_long uVar4;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffb8;
  Roaring64Map *in_stack_ffffffffffffffe0;
  
  bVar1 = isFull(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    cVar2 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cbegin(in_stack_ffffffffffffffb8);
    cVar3 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cend(in_stack_ffffffffffffffb8);
    uVar4 = std::
            accumulate<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,unsigned_long,roaring::Roaring64Map::cardinality()const::_lambda(unsigned_long,std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                      (cVar2._M_node,cVar3._M_node,0);
    return uVar4;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,"bitmap is full, cardinality is 2^64, unable to represent in a 64-bit integer")
  ;
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

uint64_t cardinality() const {
        if (isFull()) {
#if ROARING_EXCEPTIONS
            throw std::length_error(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#else
            ROARING_TERMINATE(
                "bitmap is full, cardinality is 2^64, "
                "unable to represent in a 64-bit integer");
#endif
        }
        return std::accumulate(
            roarings.cbegin(), roarings.cend(), (uint64_t)0,
            [](uint64_t previous,
               const std::pair<const uint32_t, Roaring> &map_entry) {
                return previous + map_entry.second.cardinality();
            });
    }